

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_utils.hpp
# Opt level: O0

uint64_t time_utils::parse_datetime_log(uint year,char *s)

{
  uint month_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t r;
  uint64_t total_days;
  uint millisecond;
  uint second;
  uint minute;
  uint hour;
  uint day;
  uint month;
  char *s_local;
  uint year_local;
  
  _day = s;
  s_local._4_4_ = year;
  month_00 = slurp_digits((char **)&day,'-');
  uVar1 = slurp_digits((char **)&day,'|');
  uVar2 = slurp_digits((char **)&day,':');
  uVar3 = slurp_digits((char **)&day,':');
  uVar4 = slurp_digits((char **)&day,'.');
  uVar5 = slurp_digits((char **)&day,']');
  uVar6 = cumulative_days_in_years(2000,s_local._4_4_);
  uVar7 = cumulative_days_in_months_before(s_local._4_4_,month_00);
  return (ulong)(uVar5 * 1000000) +
         ((ulong)uVar4 +
         ((ulong)uVar3 + ((ulong)uVar2 + (uVar6 + uVar7 + (ulong)(uVar1 - 1)) * 0x18) * 0x3c) * 0x3c
         ) * 1000000000;
}

Assistant:

static inline
uint64_t parse_datetime_log(unsigned year, const char *s)
{
    const auto month = slurp_digits(s, '-');
    const auto day = slurp_digits(s, '|');
    const auto hour = slurp_digits(s, ':');
    const auto minute = slurp_digits(s, ':');
    const auto second = slurp_digits(s, '.');
    const auto millisecond = slurp_digits(s, ']');

    const uint64_t total_days =
        cumulative_days_in_years(2000, year) +
        cumulative_days_in_months_before(year, month) +
        (day - 1);

    uint64_t r = total_days;

    r *= 24;
    r += hour;

    r *= 60;
    r += minute;

    r *= 60;
    r += second;

    r *= 1'000'000'000;
    r += millisecond * 1'000'000;

    return r;
}